

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O2

StorageType_conflict1 __thiscall
tcu::Float<unsigned_long,_11,_52,_1023,_3U>::mantissa(Float<unsigned_long,_11,_52,_1023,_3U> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = this->m_value;
  if ((uVar1 & 0x7fffffffffffffff) != 0) {
    uVar2 = uVar1 & 0xfffffffffffff;
    uVar3 = uVar2;
    if (uVar2 == 0) {
      uVar3 = uVar2 + 0x10000000000000;
    }
    if ((uVar1 & 0x7ff0000000000000) != 0) {
      uVar3 = uVar2 + 0x10000000000000;
    }
    return uVar3;
  }
  return 0;
}

Assistant:

inline StorageType		exponentBits	(void) const	{ return (m_value >> MantissaBits) & ((StorageType(1)<<ExponentBits)-1);	}